

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
tchecker::syncprod::system_t::labels
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *this,string *labels)

{
  pointer pbVar1;
  bool bVar2;
  label_id_t lVar3;
  size_t num_bits;
  invalid_argument *this_00;
  labels_t *this_01;
  pointer name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  is_any_ofF<char> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_01 = &this->super_labels_t;
  num_bits = index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             ::size(&this_01->_labels_index);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,num_bits,0,(allocator<unsigned_long> *)&local_68);
  bVar2 = std::operator==(labels,"");
  if (!bVar2) {
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    boost::algorithm::is_any_of<char[2]>(&local_80,(char (*) [2])",");
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
              (&v,labels,&local_80,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_80);
    pbVar1 = v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (name = v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
      bVar2 = labels_t::is_label(this_01,name);
      if (!bVar2) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Unknown label \'",name);
        std::operator+(&local_68,&local_48,"\'");
        std::invalid_argument::invalid_argument(this_00,(string *)&local_68);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      lVar3 = labels_t::label_id(this_01,name);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (__return_storage_ptr__,(ulong)lVar3,true);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&v);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> system_t::labels(std::string const & labels) const
{
  boost::dynamic_bitset<> s{this->labels_count()};
  if (labels == "")
    return s;

  std::vector<std::string> v;
  boost::split(v, labels, boost::is_any_of(","));
  for (std::string const & l : v) {
    if (!this->is_label(l))
      throw std::invalid_argument("Unknown label '" + l + "'");
    s.set(this->label_id(l));
  }
  return s;
}